

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<QList<int>>::resolve<QList<int>&>
          (PromiseData<QList<int>> *this,QList<int> *value)

{
  PromiseValue<QList<int>_> local_28;
  QList<int> *local_18;
  QList<int> *value_local;
  PromiseData<QList<int>_> *this_local;
  
  local_18 = value;
  value_local = (QList<int> *)this;
  PromiseValue<QList<int>_>::PromiseValue(&local_28,value);
  PromiseValue<QList<int>_>::operator=((PromiseValue<QList<int>_> *)(this + 0x58),&local_28);
  PromiseValue<QList<int>_>::~PromiseValue(&local_28);
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::setSettled
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }